

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memcpy_s.c
# Opt level: O3

int main(void)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char s [12];
  undefined8 uStack_30;
  undefined2 local_28;
  undefined1 uStack_26;
  char acStack_25 [13];
  
  local_28 = 0x7878;
  uStack_26 = 0x78;
  builtin_strncpy(acStack_25,"xxxxxxxx",9);
  uStack_30 = 0x103482;
  set_constraint_handler_s(test_handler);
  lVar2 = 0;
  do {
    if (((char *)((long)&local_28 + lVar2) == "abcde") || ("abcde" + lVar2 == (char *)&local_28)) {
      acStack_25[5] = 0;
      acStack_25[6] = '\0';
      acStack_25[7] = '\0';
      local_28 = 0;
      uStack_26 = 0;
      acStack_25[0] = '\0';
      acStack_25[1] = '\0';
      acStack_25[2] = '\0';
      acStack_25[3] = 0;
      acStack_25[4] = 0;
      uStack_30 = 0x1034e4;
      (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
      TEST_RESULTS = TEST_RESULTS + 1;
      uStack_30 = 0x103504;
      printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memcpy_s.c, line %d - %s\n"
             ,0x44,"memcpy_s( s, 11, abcde, 6 ) == 0");
      break;
    }
    *(char *)((long)&local_28 + lVar2) = "abcde"[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  if (acStack_25[1] != 'e') {
    TEST_RESULTS = TEST_RESULTS + 1;
    uStack_30 = 0x10352b;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memcpy_s.c, line %d - %s\n"
           ,0x45,"s[4] == \'e\'");
  }
  if (acStack_25[2] != '\0') {
    TEST_RESULTS = TEST_RESULTS + 1;
    uStack_30 = 0x103552;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memcpy_s.c, line %d - %s\n"
           ,0x46,"s[5] == \'\\0\'");
  }
  lVar2 = 5;
  pcVar3 = "abcde";
  pcVar4 = acStack_25 + 2;
  while ((pcVar4 != "abcde" && (pcVar3 != acStack_25 + 2))) {
    cVar1 = *pcVar3;
    pcVar3 = pcVar3 + 1;
    *pcVar4 = cVar1;
    pcVar4 = pcVar4 + 1;
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
LAB_001035cc:
      if (acStack_25[6] != 'e') {
        TEST_RESULTS = TEST_RESULTS + 1;
        uStack_30 = 0x1035f3;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memcpy_s.c, line %d - %s\n"
               ,0x48,"s[9] == \'e\'");
      }
      if (acStack_25[7] != 'x') {
        TEST_RESULTS = TEST_RESULTS + 1;
        uStack_30 = 0x10361a;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memcpy_s.c, line %d - %s\n"
               ,0x49,"s[10] == \'x\'");
      }
      local_28 = 0;
      uStack_26 = 0;
      acStack_25[0] = '\0';
      acStack_25[1] = 0;
      acStack_25[2] = 0x78;
      uStack_30 = 0x103649;
      (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
      if (CONCAT11(acStack_25[2],acStack_25[1]) != 0x7800 ||
          CONCAT13(acStack_25[0],CONCAT12(uStack_26,local_28)) != 0) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uStack_30 = 0x103678;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memcpy_s.c, line %d - %s\n"
               ,0x4e,"memcmp( s, \"\\0\\0\\0\\0\\0x\", 6 ) == 0");
      }
      uStack_26 = 0;
      local_28 = 0;
      uStack_30 = 0x103698;
      (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
      acStack_25[1] = 0;
      uStack_26 = 0;
      acStack_25[0] = '\0';
      uStack_30 = 0x1036b6;
      (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
      lVar2 = 3;
      do {
        *(undefined1 *)((long)&uStack_30 + lVar2 + 5) = *(undefined1 *)((long)&local_28 + lVar2);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 6);
      local_28 = 0;
      uStack_26 = 0;
      acStack_25[0] = '\0';
      uStack_30 = 0x1036e5;
      (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
      acStack_25[0] = '\0';
      acStack_25[1] = 0;
      acStack_25[2] = 0;
      acStack_25[3] = 0;
      uStack_30 = 0x1036fd;
      (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
      if (HANDLER_CALLS != 5) {
        TEST_RESULTS = TEST_RESULTS + 1;
        uStack_30 = 0x10372e;
        printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memcpy_s.c, line %d - %s\n"
               ,0x57,"HANDLER_CALLS == 5");
      }
      return TEST_RESULTS;
    }
  }
  acStack_25[6] = '\0';
  acStack_25[7] = '\0';
  acStack_25[2] = '\0';
  acStack_25[3] = 0;
  acStack_25[4] = 0;
  acStack_25[5] = 0;
  uStack_30 = 0x1035ac;
  (*_PDCLIB_constraint_handler)(_PDCLIB_lc_messages->errno_texts[0x16],(void *)0x0,0x16);
  TEST_RESULTS = TEST_RESULTS + 1;
  uStack_30 = 0x1035cc;
  printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/memcpy_s.c, line %d - %s\n"
         ,0x47,"memcpy_s( s + 5, 6, abcde, 5 ) == 0");
  goto LAB_001035cc;
}

Assistant:

int main( void )
{
#if ! defined( REGTEST ) || defined( __STDC_LIB_EXT1__ )
    char s[] = "xxxxxxxxxxx";
    set_constraint_handler_s( test_handler );

    TESTCASE( memcpy_s( s, 11, abcde, 6 ) == 0 );
    TESTCASE( s[4] == 'e' );
    TESTCASE( s[5] == '\0' );
    TESTCASE( memcpy_s( s + 5, 6, abcde, 5 ) == 0 );
    TESTCASE( s[9] == 'e' );
    TESTCASE( s[10] == 'x' );

    s[5] = 'x';

    TESTCASE( memcpy_s( s, 5, abcde, 6 ) != 0 );
    TESTCASE( memcmp( s, "\0\0\0\0\0x", 6 ) == 0 );

    TESTCASE( memcpy_s( s, 3, s + 2, 3 ) != 0 );
    TESTCASE( memcpy_s( s + 2, 3, s, 3 ) != 0 );

    /* Overlapping */
    TESTCASE( memcpy_s( s, 4, s + 3, 4 ) != 0 );
    TESTCASE( memcpy_s( s + 3, 4, s, 4 ) != 0 );

    TESTCASE( HANDLER_CALLS == 5 );
#endif
    return TEST_RESULTS;
}